

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool IsValidRealNumber(wchar_t *wsz,int length)

{
  wchar_t __wc;
  bool bVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 local_38;
  
  if (length == 0) {
LAB_00677547:
    bVar4 = false;
  }
  else if (length < 1) {
    bVar4 = true;
  }
  else {
    uVar5 = 0;
    bVar3 = 1;
    bVar4 = false;
    local_38 = 0;
    do {
      __wc = wsz[uVar5];
      iVar2 = iswspace(__wc);
      if (iVar2 == 0) {
        if ((__wc & 0xfffffffdU) == 0x2c) {
          local_38 = CONCAT44(local_38._4_4_ + 1,(int)local_38);
        }
        else if ((__wc & 0xffffffdfU) == 0x45) {
          local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
        }
        else {
          iVar2 = iswdigit(__wc);
          if (((iVar2 == 0) && (__wc != L'-')) && (__wc != L'+')) goto LAB_00677547;
        }
        bVar3 = 0;
        bVar1 = false;
        if (bVar4) {
          return false;
        }
      }
      else {
        bVar1 = (bool)(bVar3 ^ 1 | bVar4);
      }
      bVar4 = bVar1;
      uVar5 = uVar5 + 1;
    } while ((uint)length != uVar5);
    bVar4 = (int)local_38 < 2 && local_38._4_4_ < 2;
  }
  return bVar4;
}

Assistant:

static bool IsValidRealNumber(const wchar_t* wsz, int length)
{
  if (length == 0)
    return false;

  int puncCount = 0;
  int eCount = 0;

  bool bAtStart = true;
  bool bAtEnd = false;

  for (int i = 0; i < length; i++)
  {
    const auto w = wsz[i];

    // Skip past whitespace at the start of the string.
    if (iswspace(w))
    {
      if (bAtStart)
      {
        // Skip past white space at the beginning of string.
        continue;
      }
      else
      {
        // Otherwise, whitespace can only appear at the end of the string.
        bAtEnd = true;
        continue;
      }
    }

    if (w == L'.' || w == L',') puncCount++;
    else
    if (w == L'e' || w == L'E') eCount++;
    else
    if (!iswdigit(w) && (w != L'-') && (w != L'+'))
      return false;

    // Nothing can come after spaces at the end.
    if (bAtEnd)
      return false;

    bAtStart = false;
  }

  if ((puncCount > 1) || (eCount > 1))
    return false;

  return true;
}